

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::propagatePseudoobj
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  undefined8 *puVar2;
  uint *puVar3;
  Real RVar4;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  type_conflict5 tVar6;
  bool bVar7;
  double *pdVar8;
  TightenBoundsPS *pTVar9;
  pointer pnVar10;
  uint j;
  ulong uVar11;
  long lVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  objval;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  undefined1 local_508 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_500;
  uint local_4f8 [3];
  undefined3 uStack_4eb;
  uint local_4e8;
  undefined3 uStack_4e3;
  int local_4e0;
  bool local_4dc;
  undefined8 local_4d8;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4c8;
  cpp_dec_float<50U,_int,_void> *local_4c0;
  Tolerances *local_4b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4b0;
  uint local_4a8 [3];
  undefined3 uStack_49b;
  uint uStack_498;
  undefined8 uStack_493;
  undefined8 local_488;
  undefined1 local_478 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_470;
  uint local_468 [2];
  uint auStack_460 [2];
  uint local_458 [2];
  int local_450;
  bool local_44c;
  fpclass_type local_448;
  int32_t iStack_444;
  cpp_dec_float<50U,_int,_void> *local_440;
  cpp_dec_float<50U,_int,_void> local_438;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_3f8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_3e8;
  cpp_dec_float<50U,_int,_void> local_3d8;
  element_type *local_398;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_390;
  uint local_388 [2];
  uint auStack_380 [2];
  uint local_378 [2];
  int local_370;
  bool local_36c;
  fpclass_type local_368;
  int32_t local_364;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d8;
  Tolerances *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_290;
  uint local_288 [2];
  uint auStack_280 [2];
  uint local_278 [2];
  int local_270;
  bool local_26c;
  fpclass_type local_268;
  int32_t iStack_264;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  Tolerances *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_190;
  uint local_188 [2];
  uint auStack_180 [2];
  uint local_178 [2];
  int local_170;
  bool local_16c;
  fpclass_type local_168;
  int32_t iStack_164;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_3d8.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 8);
  local_3d8.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_objoffset.m_backend.data._M_elems;
  local_3d8.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 2);
  local_3d8.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 4);
  local_3d8.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).m_objoffset.m_backend.data._M_elems + 6);
  local_3d8.exp =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.exp;
  local_3d8.neg =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.neg;
  local_3d8.fpclass =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.fpclass;
  local_3d8.prec_elem =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).m_objoffset.m_backend.prec_elem;
  uVar11 = (ulong)(uint)(lp->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum;
  lVar12 = uVar11 * 0x38;
  local_4c8 = this;
  while( true ) {
    pSVar5 = local_4c8;
    if ((int)uVar11 < 1) break;
    pnVar10 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).object.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_458 = *(uint (*) [2])((long)pnVar10[-1].m_backend.data._M_elems + lVar12 + 0x20);
    puVar2 = (undefined8 *)((long)pnVar10[-1].m_backend.data._M_elems + lVar12);
    local_478 = (undefined1  [8])*puVar2;
    _Stack_470._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar2[1];
    puVar3 = (uint *)((long)pnVar10[-1].m_backend.data._M_elems + lVar12 + 0x10);
    local_468 = *(uint (*) [2])puVar3;
    auStack_460 = *(uint (*) [2])(puVar3 + 2);
    local_450 = *(int *)((long)(&pnVar10[-1].m_backend.data + 1) + lVar12);
    local_44c = *(bool *)((long)(&pnVar10[-1].m_backend.data + 1) + lVar12 + 4U);
    _local_448 = *(undefined8 *)((long)(&pnVar10[-1].m_backend.data + 1) + lVar12 + 8U);
    local_508 = (undefined1  [8])((ulong)local_508 & 0xffffffff00000000);
    tVar6 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_478,(int *)local_508);
    if (tVar6) {
      pnVar10 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar8 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)local_508,-*pdVar8,(type *)0x0);
      tVar6 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)pnVar10[-1].m_backend.data._M_elems + lVar12),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_508);
      if (tVar6) {
        return;
      }
      pnVar10 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_0026d6ff:
      local_4d8._0_4_ = cpp_dec_float_finite;
      local_4d8._4_4_ = 10;
      local_508 = (undefined1  [8])0x0;
      _Stack_500._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4f8[0] = 0;
      local_4f8[1] = 0;
      stack0xfffffffffffffb10 = 0;
      uStack_4eb = 0;
      _local_4e8 = 0;
      uStack_4e3 = 0;
      local_4e0 = 0;
      local_4dc = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)local_508,
                 (cpp_dec_float<50U,_int,_void> *)local_478,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)pnVar10[-1].m_backend.data._M_elems + lVar12));
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_3d8,(cpp_dec_float<50U,_int,_void> *)local_508);
    }
    else {
      local_508 = (undefined1  [8])((ulong)local_508 & 0xffffffff00000000);
      tVar6 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_478,(int *)local_508);
      if (tVar6) {
        pnVar10 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)local_508,-*pdVar8,(type *)0x0);
        tVar6 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)pnVar10[-1].m_backend.data._M_elems + lVar12),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_508);
        if (tVar6) {
          return;
        }
        pnVar10 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_0026d6ff;
      }
    }
    uVar11 = (ulong)((int)uVar11 - 1);
    lVar12 = lVar12 + -0x38;
  }
  local_118.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((local_4c8->m_cutoffbound).m_backend.data._M_elems + 8);
  local_118.m_backend.data._M_elems[0] = (local_4c8->m_cutoffbound).m_backend.data._M_elems[0];
  local_118.m_backend.data._M_elems[1] = (local_4c8->m_cutoffbound).m_backend.data._M_elems[1];
  local_118.m_backend.data._M_elems[2] = (local_4c8->m_cutoffbound).m_backend.data._M_elems[2];
  local_118.m_backend.data._M_elems[3] = (local_4c8->m_cutoffbound).m_backend.data._M_elems[3];
  local_118.m_backend.data._M_elems[4] = (local_4c8->m_cutoffbound).m_backend.data._M_elems[4];
  local_118.m_backend.data._M_elems[5] = (local_4c8->m_cutoffbound).m_backend.data._M_elems[5];
  local_118.m_backend.data._M_elems[6] = (local_4c8->m_cutoffbound).m_backend.data._M_elems[6];
  local_118.m_backend.data._M_elems[7] = (local_4c8->m_cutoffbound).m_backend.data._M_elems[7];
  local_118.m_backend.exp = (local_4c8->m_cutoffbound).m_backend.exp;
  local_118.m_backend.neg = (local_4c8->m_cutoffbound).m_backend.neg;
  local_118.m_backend.fpclass = (local_4c8->m_cutoffbound).m_backend.fpclass;
  local_118.m_backend.prec_elem = (local_4c8->m_cutoffbound).m_backend.prec_elem;
  pdVar8 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_68,-*pdVar8,(type *)0x0);
  psVar1 = &(pSVar5->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_478,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  RVar4 = Tolerances::epsilon((Tolerances *)local_478);
  bVar7 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (&local_118,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_68,RVar4);
  if (bVar7) {
    local_440 = &(pSVar5->m_cutoffbound).m_backend;
    local_158.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pSVar5->m_cutoffbound).m_backend.data._M_elems + 8);
    local_158.m_backend.data._M_elems[0] =
         (((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)local_440)->m_backend).data._M_elems[0];
    local_158.m_backend.data._M_elems[1] = (pSVar5->m_cutoffbound).m_backend.data._M_elems[1];
    local_158.m_backend.data._M_elems[2] = (pSVar5->m_cutoffbound).m_backend.data._M_elems[2];
    local_158.m_backend.data._M_elems[3] = (pSVar5->m_cutoffbound).m_backend.data._M_elems[3];
    local_158.m_backend.data._M_elems[4] = (pSVar5->m_cutoffbound).m_backend.data._M_elems[4];
    local_158.m_backend.data._M_elems[5] = (pSVar5->m_cutoffbound).m_backend.data._M_elems[5];
    local_158.m_backend.data._M_elems[6] = (pSVar5->m_cutoffbound).m_backend.data._M_elems[6];
    local_158.m_backend.data._M_elems[7] = (pSVar5->m_cutoffbound).m_backend.data._M_elems[7];
    local_158.m_backend.exp = (pSVar5->m_cutoffbound).m_backend.exp;
    local_158.m_backend.neg = (pSVar5->m_cutoffbound).m_backend.neg;
    local_158.m_backend.fpclass = (pSVar5->m_cutoffbound).m_backend.fpclass;
    local_158.m_backend.prec_elem = (pSVar5->m_cutoffbound).m_backend.prec_elem;
    pdVar8 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_a0,*pdVar8,(type *)0x0);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_508,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar4 = Tolerances::epsilon((Tolerances *)local_508);
    bVar7 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_158,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_a0,RVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_500);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_470);
    if (bVar7) {
      local_4c0 = &(pSVar5->m_pseudoobj).m_backend;
      tVar6 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_3d8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_4c0);
      if (tVar6) {
        *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_4c0->data)->data)._M_elems + 8) =
             local_3d8.data._M_elems._32_8_;
        *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_4c0->data)->data)._M_elems + 4) =
             local_3d8.data._M_elems._16_8_;
        *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_4c0->data)->data)._M_elems + 6) =
             local_3d8.data._M_elems._24_8_;
        *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_4c0->data)->data)._M_elems =
             local_3d8.data._M_elems._0_8_;
        *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_4c0->data)->data)._M_elems + 2) =
             local_3d8.data._M_elems._8_8_;
        (pSVar5->m_pseudoobj).m_backend.exp = local_3d8.exp;
        (pSVar5->m_pseudoobj).m_backend.neg = local_3d8.neg;
        (pSVar5->m_pseudoobj).m_backend.fpclass = local_3d8.fpclass;
        (pSVar5->m_pseudoobj).m_backend.prec_elem = local_3d8.prec_elem;
      }
      j = (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
      local_4c8 = (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&pSVar5->m_hist;
LAB_0026d95c:
      do {
        do {
          if ((int)j < 1) {
            return;
          }
          j = j - 1;
          pnVar10 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).object.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_458 = *(uint (*) [2])(pnVar10[j].m_backend.data._M_elems + 8);
          local_478 = *(undefined1 (*) [8])&pnVar10[j].m_backend.data;
          _Stack_470._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                (pnVar10[j].m_backend.data._M_elems + 2);
          puVar3 = pnVar10[j].m_backend.data._M_elems + 4;
          local_468 = *(uint (*) [2])puVar3;
          auStack_460 = *(uint (*) [2])(puVar3 + 2);
          local_450 = pnVar10[j].m_backend.exp;
          local_44c = pnVar10[j].m_backend.neg;
          local_368 = pnVar10[j].m_backend.fpclass;
          local_364 = pnVar10[j].m_backend.prec_elem;
          iStack_444 = local_364;
          local_448 = local_368;
          local_398 = (element_type *)local_478;
          p_Stack_390 = _Stack_470._M_pi;
          local_388 = local_468;
          auStack_380 = auStack_460;
          local_378 = local_458;
          local_370 = local_450;
          local_36c = local_44c;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&local_d8,0.0,(type *)0x0);
          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_508,
                     &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
          RVar4 = Tolerances::epsilon((Tolerances *)local_508);
          bVar7 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_398,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_d8,RVar4);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_500);
        } while (bVar7);
        local_508 = (undefined1  [8])0x0;
        tVar6 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_478,(double *)local_508);
        if (!tVar6) goto LAB_0026dc13;
        pnVar10 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_438.fpclass = cpp_dec_float_finite;
        local_438.prec_elem = 10;
        local_438.data._M_elems[0] = 0;
        local_438.data._M_elems[1] = 0;
        local_438.data._M_elems[2] = 0;
        local_438.data._M_elems[3] = 0;
        local_438.data._M_elems[4] = 0;
        local_438.data._M_elems[5] = 0;
        local_438.data._M_elems._24_5_ = 0;
        local_438.data._M_elems[7]._1_3_ = 0;
        local_438.data._M_elems._32_5_ = 0;
        local_438._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_438,local_440,local_4c0);
        local_488._0_4_ = cpp_dec_float_finite;
        local_488._4_4_ = 10;
        local_4b8 = (Tolerances *)0x0;
        _Stack_4b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_4a8[0] = 0;
        local_4a8[1] = 0;
        stack0xfffffffffffffb60 = 0;
        uStack_49b = 0;
        _uStack_498 = 0;
        uStack_493 = 0;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)&local_4b8,&local_438,
                   (cpp_dec_float<50U,_int,_void> *)local_478);
        local_4d8._0_4_ = cpp_dec_float_finite;
        local_4d8._4_4_ = 10;
        local_508 = (undefined1  [8])0x0;
        _Stack_500._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_4f8[0] = 0;
        local_4f8[1] = 0;
        stack0xfffffffffffffb10 = 0;
        uStack_4eb = 0;
        _local_4e8 = 0;
        uStack_4e3 = 0;
        local_4e0 = 0;
        local_4dc = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_508,&pnVar10[j].m_backend,
                   (cpp_dec_float<50U,_int,_void> *)&local_4b8);
        auStack_180[1]._1_3_ = uStack_4eb;
        auStack_180._0_5_ = stack0xfffffffffffffb10;
        local_198 = (Tolerances *)local_508;
        p_Stack_190 = _Stack_500._M_pi;
        local_188[0] = local_4f8[0];
        local_188[1] = local_4f8[1];
        local_178[1]._1_3_ = uStack_4e3;
        local_178._0_5_ = _local_4e8;
        local_170 = local_4e0;
        local_16c = local_4dc;
        local_168 = (fpclass_type)local_4d8;
        iStack_164 = local_4d8._4_4_;
        pnVar10 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_1d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[j].m_backend.data;
        local_1d8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)(pnVar10[j].m_backend.data._M_elems + 2);
        puVar3 = pnVar10[j].m_backend.data._M_elems + 4;
        local_1d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
        local_1d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
        local_1d8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)(pnVar10[j].m_backend.data._M_elems + 8);
        local_1d8.m_backend.exp = pnVar10[j].m_backend.exp;
        local_1d8.m_backend.neg = pnVar10[j].m_backend.neg;
        local_1d8.m_backend.fpclass = pnVar10[j].m_backend.fpclass;
        local_1d8.m_backend.prec_elem = pnVar10[j].m_backend.prec_elem;
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&local_4b8,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar4 = Tolerances::epsilon(local_4b8);
        bVar7 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_198,&local_1d8,RVar4);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4b0);
      } while (!bVar7);
      pTVar9 = (TightenBoundsPS *)operator_new(0xa0);
      pnVar10 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[j].m_backend.data;
      local_218.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar10[j].m_backend.data._M_elems + 2);
      puVar3 = pnVar10[j].m_backend.data._M_elems + 4;
      local_218.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      local_218.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
      local_218.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar10[j].m_backend.data._M_elems + 8);
      local_218.m_backend.exp = pnVar10[j].m_backend.exp;
      local_218.m_backend.neg = pnVar10[j].m_backend.neg;
      local_218.m_backend.fpclass = pnVar10[j].m_backend.fpclass;
      local_218.m_backend.prec_elem = pnVar10[j].m_backend.prec_elem;
      pnVar10 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_258.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[j].m_backend.data;
      local_258.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar10[j].m_backend.data._M_elems + 2);
      puVar3 = pnVar10[j].m_backend.data._M_elems + 4;
      local_258.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      local_258.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
      local_258.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar10[j].m_backend.data._M_elems + 8);
      local_258.m_backend.exp = pnVar10[j].m_backend.exp;
      local_258.m_backend.neg = pnVar10[j].m_backend.neg;
      local_258.m_backend.fpclass = pnVar10[j].m_backend.fpclass;
      local_258.m_backend.prec_elem = pnVar10[j].m_backend.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_3e8,
                 &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      TightenBoundsPS::TightenBoundsPS
                (pTVar9,lp,j,&local_218,&local_258,(shared_ptr<soplex::Tolerances> *)&local_3e8);
      std::
      __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
      ::
      __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::TightenBoundsPS,void>
                ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                  *)&local_4b8,pTVar9);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3e8._M_refcount);
      std::
      vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
      ::push_back((vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                   *)local_4c8,(value_type *)&local_4b8);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2d])(lp,(ulong)j,local_508,0);
      goto LAB_0026e01d;
    }
  }
  else {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_470);
  }
  return;
LAB_0026dc13:
  local_508 = (undefined1  [8])0x0;
  tVar6 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_478,(double *)local_508);
  if (tVar6) {
    pnVar10 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).up.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_438.fpclass = cpp_dec_float_finite;
    local_438.prec_elem = 10;
    local_438.data._M_elems[0] = 0;
    local_438.data._M_elems[1] = 0;
    local_438.data._M_elems[2] = 0;
    local_438.data._M_elems[3] = 0;
    local_438.data._M_elems[4] = 0;
    local_438.data._M_elems[5] = 0;
    local_438.data._M_elems._24_5_ = 0;
    local_438.data._M_elems[7]._1_3_ = 0;
    local_438.data._M_elems._32_5_ = 0;
    local_438._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_438,local_440,local_4c0);
    local_488._0_4_ = cpp_dec_float_finite;
    local_488._4_4_ = 10;
    local_4b8 = (Tolerances *)0x0;
    _Stack_4b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_4a8[0] = 0;
    local_4a8[1] = 0;
    stack0xfffffffffffffb60 = 0;
    uStack_49b = 0;
    _uStack_498 = 0;
    uStack_493 = 0;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)&local_4b8,&local_438,
               (cpp_dec_float<50U,_int,_void> *)local_478);
    local_4d8._0_4_ = cpp_dec_float_finite;
    local_4d8._4_4_ = 10;
    local_508 = (undefined1  [8])0x0;
    _Stack_500._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_4f8[0] = 0;
    local_4f8[1] = 0;
    stack0xfffffffffffffb10 = 0;
    uStack_4eb = 0;
    _local_4e8 = 0;
    uStack_4e3 = 0;
    local_4e0 = 0;
    local_4dc = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)local_508,&pnVar10[j].m_backend,
               (cpp_dec_float<50U,_int,_void> *)&local_4b8);
    auStack_280[1]._1_3_ = uStack_4eb;
    auStack_280._0_5_ = stack0xfffffffffffffb10;
    local_298 = (Tolerances *)local_508;
    p_Stack_290 = _Stack_500._M_pi;
    local_288[0] = local_4f8[0];
    local_288[1] = local_4f8[1];
    local_278[1]._1_3_ = uStack_4e3;
    local_278._0_5_ = _local_4e8;
    local_270 = local_4e0;
    local_26c = local_4dc;
    local_268 = (fpclass_type)local_4d8;
    iStack_264 = local_4d8._4_4_;
    pnVar10 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).low.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_2d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[j].m_backend.data;
    local_2d8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(pnVar10[j].m_backend.data._M_elems + 2);
    puVar3 = pnVar10[j].m_backend.data._M_elems + 4;
    local_2d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
    local_2d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
    local_2d8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(pnVar10[j].m_backend.data._M_elems + 8);
    local_2d8.m_backend.exp = pnVar10[j].m_backend.exp;
    local_2d8.m_backend.neg = pnVar10[j].m_backend.neg;
    local_2d8.m_backend.fpclass = pnVar10[j].m_backend.fpclass;
    local_2d8.m_backend.prec_elem = pnVar10[j].m_backend.prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&local_4b8,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar4 = Tolerances::epsilon(local_4b8);
    bVar7 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_298,&local_2d8,RVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4b0);
    if (bVar7) {
      pTVar9 = (TightenBoundsPS *)operator_new(0xa0);
      pnVar10 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_318.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[j].m_backend.data;
      local_318.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar10[j].m_backend.data._M_elems + 2);
      puVar3 = pnVar10[j].m_backend.data._M_elems + 4;
      local_318.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      local_318.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
      local_318.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar10[j].m_backend.data._M_elems + 8);
      local_318.m_backend.exp = pnVar10[j].m_backend.exp;
      local_318.m_backend.neg = pnVar10[j].m_backend.neg;
      local_318.m_backend.fpclass = pnVar10[j].m_backend.fpclass;
      local_318.m_backend.prec_elem = pnVar10[j].m_backend.prec_elem;
      pnVar10 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_358.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[j].m_backend.data;
      local_358.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar10[j].m_backend.data._M_elems + 2);
      puVar3 = pnVar10[j].m_backend.data._M_elems + 4;
      local_358.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar3;
      local_358.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar3 + 2);
      local_358.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)(pnVar10[j].m_backend.data._M_elems + 8);
      local_358.m_backend.exp = pnVar10[j].m_backend.exp;
      local_358.m_backend.neg = pnVar10[j].m_backend.neg;
      local_358.m_backend.fpclass = pnVar10[j].m_backend.fpclass;
      local_358.m_backend.prec_elem = pnVar10[j].m_backend.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_3f8,
                 &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      TightenBoundsPS::TightenBoundsPS
                (pTVar9,lp,j,&local_318,&local_358,(shared_ptr<soplex::Tolerances> *)&local_3f8);
      std::
      __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
      ::
      __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::TightenBoundsPS,void>
                ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                  *)&local_4b8,pTVar9);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3f8._M_refcount);
      std::
      vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
      ::push_back((vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                   *)local_4c8,(value_type *)&local_4b8);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2a])(lp,(ulong)j,local_508,0);
LAB_0026e01d:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_4b0);
    }
  }
  goto LAB_0026d95c;
}

Assistant:

void SPxMainSM<R>::propagatePseudoobj(SPxLPBase<R>& lp)
{
   R pseudoObj = this->m_objoffset;

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      R val = lp.maxObj(j);

      if(val < 0)
      {
         if(lp.lower(j) <= R(-infinity))
            return;

         pseudoObj += val * lp.lower(j);
      }
      else if(val > 0)
      {
         if(lp.upper(j) >= R(-infinity))
            return;

         pseudoObj += val * lp.upper(j);
      }
   }

   if(GT(m_cutoffbound, R(-infinity), this->tolerances()->epsilon())
         && LT(m_cutoffbound, R(infinity), this->tolerances()->epsilon()))
   {
      if(pseudoObj > m_pseudoobj)
         m_pseudoobj = pseudoObj;

      for(int j = lp.nCols() - 1; j >= 0; --j)
      {
         R objval = lp.maxObj(j);

         if(EQ(objval, R(0.0), this->tolerances()->epsilon()))
            continue;

         if(objval < 0.0)
         {
            R newbound = lp.lower(j) + (m_cutoffbound - m_pseudoobj) / objval;

            if(LT(newbound, lp.upper(j), this->tolerances()->epsilon()))
            {
               std::shared_ptr<PostStep> ptr(new TightenBoundsPS(lp, j, lp.upper(j), lp.lower(j),
                                             this->_tolerances));
               m_hist.append(ptr);
               lp.changeUpper(j, newbound);
            }
         }
         else if(objval > 0.0)
         {
            R newbound = lp.upper(j) + (m_cutoffbound - m_pseudoobj) / objval;

            if(GT(newbound, lp.lower(j), this->tolerances()->epsilon()))
            {
               std::shared_ptr<PostStep> ptr(new TightenBoundsPS(lp, j, lp.upper(j), lp.lower(j),
                                             this->_tolerances));
               m_hist.append(ptr);
               lp.changeLower(j, newbound);
            }
         }
      }
   }
}